

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

void memJoin(void *dest,void *src1,size_t count1,void *src2,size_t count2)

{
  size_t sVar1;
  undefined1 *__dest;
  undefined1 *__dest_00;
  undefined1 *__src;
  undefined1 uVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  undefined1 *__dest_01;
  undefined1 *puVar8;
  size_t sVar9;
  bool bVar10;
  bool bVar11;
  void *local_68;
  
  bVar10 = count1 == 0;
  bVar11 = count2 == 0;
  bVar3 = bVar10 || bVar11;
  __dest_01 = (undefined1 *)((long)dest + count1);
  local_68 = src1;
  if (((!bVar10 && !bVar11) && (src2 < __dest_01)) && (dest < (void *)((long)src2 + count2))) {
    __dest = (undefined1 *)((long)dest + count2);
    lVar5 = (long)src2 + -1;
    sVar9 = 1 - count1;
    sVar6 = 0;
    puVar8 = __dest_01;
    do {
      __dest_00 = (undefined1 *)((long)dest + sVar6);
      __src = (undefined1 *)((long)src1 + sVar6);
      if ((puVar8 + count2 <= __src) || (__src <= __dest_00)) {
        if (!bVar11) {
          memmove(__dest_01,src2,count2 - sVar6);
        }
        if (bVar10) {
          return;
        }
        count2 = count1 - sVar6;
        src2 = __src;
        __dest_01 = __dest_00;
        goto LAB_00112e64;
      }
      if (((__dest <= __src) || (!(bool)(bVar3 ^ 1))) ||
         ((undefined1 *)((long)src1 + count1) <= __dest_00)) {
        if (!bVar11) {
          memmove(__dest_00,src2,count2 - sVar6);
        }
        if (!bVar10) {
          memmove(__dest,__src,count1 - sVar6);
        }
        if (count2 == sVar6) {
          return;
        }
        uVar7 = 0;
        do {
          uVar2 = *__dest_00;
          if (count2 != sVar9) {
            memmove(__dest_00,(void *)((long)dest + sVar6 + 1),count2 - sVar9);
          }
          puVar8[count2 - 1] = uVar2;
          uVar7 = uVar7 + 1;
        } while (uVar7 < count2 - sVar6);
        return;
      }
      if ((puVar8 + count2 <= src2) || (src2 <= __dest_00)) {
        if (!bVar10) {
          memmove(__dest,__src,count1 - sVar6);
        }
        if (!bVar11) {
          memmove(__dest_00,src2,count2 - sVar6);
        }
        if (count2 == sVar6) {
          return;
        }
        uVar7 = 0;
        do {
          uVar2 = *__dest_00;
          if (count2 != sVar9) {
            memmove(__dest_00,(void *)((long)dest + sVar6 + 1),count2 - sVar9);
          }
          puVar8[count2 - 1] = uVar2;
          uVar7 = uVar7 + 1;
        } while (uVar7 < count2 - sVar6);
        return;
      }
      *(undefined1 *)((long)dest + sVar6) = *__src;
      puVar8[count2 - 1] = *(undefined1 *)(lVar5 + count2);
      bVar10 = count1 - 1 == sVar6;
      bVar11 = count2 - 1 == sVar6;
      bVar3 = bVar10 || bVar11;
      sVar1 = sVar6 + 1;
      if (bVar3) break;
      uVar7 = lVar5 + count2;
      lVar4 = sVar6 + 1;
      sVar9 = sVar9 + 2;
      puVar8 = puVar8 + -1;
      lVar5 = lVar5 + -1;
      sVar6 = sVar1;
    } while ((ulong)((long)dest + lVar4) < uVar7);
    count2 = count2 - sVar1;
    dest = (void *)((long)dest + sVar1);
    count1 = count1 - sVar1;
    local_68 = (void *)((long)src1 + sVar1);
  }
  if (!bVar10) {
    memmove(dest,local_68,count1);
  }
  if (bVar11) {
    return;
  }
LAB_00112e64:
  memmove(__dest_01,src2,count2);
  return;
}

Assistant:

void memJoin(void* dest, const void* src1, size_t count1, const void* src2,
	size_t count2)
{
	register octet o;
	size_t i;
	ASSERT(memIsValid(src1, count1));
	ASSERT(memIsValid(src2, count2));
	ASSERT(memIsValid(dest, count1 + count2));
repeat:
	if (memIsDisjoint2(dest, count1, src2, count2))
	{
		memMove(dest, src1, count1);
		memMove((octet*)dest + count1, src2, count2);
	}
	else if (memIsDisjoint2((octet*)dest + count1, count2, src1, count1))
	{
		memMove((octet*)dest + count1, src2, count2);
		memMove(dest, src1, count1);
	}
	else if (memIsDisjoint2(dest, count2, src1, count1))
	{
		// dest <- src2 || src1
		memMove(dest, src2, count2);
		memMove((octet*)dest + count2, src1, count1);
		// dest <- dest <<< count2
		for (i = 0; i < count2; ++i)
		{
			o = ((octet*)dest)[0];
			memMove(dest, (octet*)dest + 1, count1 + count2 - 1);
			((octet*)dest)[count1 + count2 - 1] = o;
		}
	}
	else if (memIsDisjoint2((octet*)dest + count2, count1, src2, count2))
	{
		// dest <- src2 || src1
		memMove((octet*)dest + count2, src1, count1);
		memMove(dest, src2, count2);
		// dest <- dest <<< count2
		for (i = 0; i < count2; ++i)
		{
			o = ((octet*)dest)[0];
			memMove(dest, (octet*)dest + 1, count1 + count2 - 1);
			((octet*)dest)[count1 + count2 - 1] = o;
		}
	}
	else
	{
		// src1 (src2) пересекается и с префиксом, и с суффиксом dest
		// длины count2 (count1) => и первый, и последний октет dest
		// не входят не входят ни в src1, ни в src2
		((octet*)dest)[0] = ((const octet*)src1)[0];
		((octet*)dest)[count1 + count2 - 1] = ((const octet*)src2)[count2 - 1];
		VERIFY(count1--);
		VERIFY(count2--);
		src1 = (const octet*)src1 + 1;
		dest = (octet*)dest + 1;
		goto repeat;
	}
}